

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_parser.cpp
# Opt level: O0

TypeAst * clickhouse::ParseTypeName(string *type_name)

{
  string_view name;
  bool bVar1;
  byte bVar2;
  int iVar3;
  iterator iVar4;
  pointer ppVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  string *in_RDI;
  mapped_type *ast;
  iterator it;
  lock_guard<std::mutex> guard;
  TypeAst *in_stack_00000130;
  TypeParser *in_stack_00000138;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  lock_guard<std::mutex> *in_stack_ffffffffffffff30;
  mapped_type *this;
  key_type *in_stack_ffffffffffffff68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
  *in_stack_ffffffffffffff70;
  _Self local_38 [3];
  _Self local_20 [2];
  string *local_10;
  mapped_type *local_8;
  
  local_10 = in_RDI;
  if ((ParseTypeName(std::__cxx11::string_const&)::ast_cache_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ParseTypeName(std::__cxx11::string_const&)::ast_cache_abi_cxx11_)
     , iVar3 != 0)) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
           *)0x23d2b5);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
                 ::~map,&ParseTypeName(std::__cxx11::string_const&)::ast_cache_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&ParseTypeName(std::__cxx11::string_const&)::ast_cache_abi_cxx11_);
  }
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff30,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  iVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
          ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                 (key_type *)0x23d303);
  local_20[0]._M_node = iVar4._M_node;
  local_38[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
              *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  bVar1 = std::operator!=(local_20,local_38);
  if (bVar1) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>
                           *)0x23d353);
    local_8 = &ppVar5->second;
  }
  else {
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
             ::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    this = pmVar6;
    pcVar7 = (char *)std::__cxx11::string::operator_cast_to_basic_string_view(local_10);
    name._M_str = pcVar7;
    name._M_len = (size_t)iVar4._M_node;
    TypeParser::TypeParser((TypeParser *)this,name);
    bVar2 = TypeParser::Parse(in_stack_00000138,in_stack_00000130);
    TypeParser::~TypeParser((TypeParser *)0x23d3ff);
    local_8 = pmVar6;
    if ((bVar2 & 1) == 0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
      ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
               *)this,(key_type *)CONCAT17(bVar2,in_stack_ffffffffffffff28));
      local_8 = (mapped_type *)0x0;
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x23d480);
  return local_8;
}

Assistant:

const TypeAst* ParseTypeName(const std::string& type_name) {
    // Cache for type_name.
    // Usually we won't have too many type names in the cache, so do not try to
    // limit cache size.
    static std::map<std::string, TypeAst> ast_cache;
    static std::mutex lock;

    std::lock_guard<std::mutex> guard(lock);
    auto it = ast_cache.find(type_name);
    if (it != ast_cache.end()) {
        return &it->second;
    }

    auto& ast = ast_cache[type_name];
    if (TypeParser(type_name).Parse(&ast)) {
        return &ast;
    }
    ast_cache.erase(type_name);
    return nullptr;
}